

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

optional<std::shared_ptr<ScriptAstNode>_> * __thiscall
Parser::parseScript(optional<std::shared_ptr<ScriptAstNode>_> *__return_storage_ptr__,Parser *this)

{
  pointer *this_00;
  int iVar1;
  undefined8 uVar2;
  bool bVar3;
  bool bVar4;
  optional<std::shared_ptr<ScriptAstNode>_> *poVar5;
  undefined1 local_78 [24];
  vector<std::shared_ptr<StatementAstNode>,_std::allocator<std::shared_ptr<StatementAstNode>_>_>
  statements;
  optional<std::shared_ptr<StatementAstNode>_> statement;
  
  statement.super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>._M_payload.
  super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>.
  super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._16_8_ = __return_storage_ptr__;
  TokenBuffer::nextToken((TokenBuffer *)local_78);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_78 + 8));
  statements.
  super__Vector_base<std::shared_ptr<StatementAstNode>,_std::allocator<std::shared_ptr<StatementAstNode>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78._16_8_ = 0;
  statements.
  super__Vector_base<std::shared_ptr<StatementAstNode>,_std::allocator<std::shared_ptr<StatementAstNode>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  bVar4 = false;
  this_00 = &statements.
             super__Vector_base<std::shared_ptr<StatementAstNode>,_std::allocator<std::shared_ptr<StatementAstNode>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  while( true ) {
    skipWhiteSpace(this);
    TokenBuffer::currentToken((TokenBuffer *)this_00);
    iVar1 = *(int *)&statements.
                     super__Vector_base<std::shared_ptr<StatementAstNode>,_std::allocator<std::shared_ptr<StatementAstNode>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage[2].
                     super___shared_ptr<StatementAstNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&statement);
    if (iVar1 == 1) break;
    parseStatement((optional<std::shared_ptr<StatementAstNode>_> *)this_00,this);
    bVar3 = true;
    if (statement.super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>._M_payload.
        super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>.
        super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._M_payload._8_1_ == '\x01')
    {
      std::
      vector<std::shared_ptr<StatementAstNode>,_std::allocator<std::shared_ptr<StatementAstNode>_>_>
      ::push_back((vector<std::shared_ptr<StatementAstNode>,_std::allocator<std::shared_ptr<StatementAstNode>_>_>
                   *)(local_78 + 0x10),(value_type *)this_00);
      bVar3 = bVar4;
    }
    bVar4 = bVar3;
    std::_Optional_payload_base<std::shared_ptr<StatementAstNode>_>::_M_reset
              ((_Optional_payload_base<std::shared_ptr<StatementAstNode>_> *)this_00);
  }
  if (bVar4) {
    *(undefined1 *)
     (statement.super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>._M_payload.
      super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>.
      super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._16_8_ + 0x10) = 0;
    poVar5 = (optional<std::shared_ptr<ScriptAstNode>_> *)
             statement.super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>.
             _M_payload.
             super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>.
             super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._16_8_;
  }
  else {
    std::
    make_shared<ScriptAstNode,std::vector<std::shared_ptr<StatementAstNode>,std::allocator<std::shared_ptr<StatementAstNode>>>&>
              ((vector<std::shared_ptr<StatementAstNode>,_std::allocator<std::shared_ptr<StatementAstNode>_>_>
                *)&statements.
                   super__Vector_base<std::shared_ptr<StatementAstNode>,_std::allocator<std::shared_ptr<StatementAstNode>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
    poVar5 = (optional<std::shared_ptr<ScriptAstNode>_> *)
             statement.super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>.
             _M_payload.
             super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>.
             super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._16_8_;
    uVar2 = statement.super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>.
            _M_payload.
            super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>.
            super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._M_payload._M_value.
            super___shared_ptr<StatementAstNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    *(pointer *)
     statement.super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>._M_payload.
     super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>.
     super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._16_8_ =
         statements.
         super__Vector_base<std::shared_ptr<StatementAstNode>,_std::allocator<std::shared_ptr<StatementAstNode>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    statement.super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>._M_payload.
    super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>.
    super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._M_payload._M_value.
    super___shared_ptr<StatementAstNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
    *(undefined8 *)
     (statement.super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>._M_payload.
      super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>.
      super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._16_8_ + 8) = uVar2;
    statements.
    super__Vector_base<std::shared_ptr<StatementAstNode>,_std::allocator<std::shared_ptr<StatementAstNode>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    *(undefined1 *)
     (statement.super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>._M_payload.
      super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>.
      super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._16_8_ + 0x10) = 1;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&statement);
  }
  std::
  vector<std::shared_ptr<StatementAstNode>,_std::allocator<std::shared_ptr<StatementAstNode>_>_>::
  ~vector((vector<std::shared_ptr<StatementAstNode>,_std::allocator<std::shared_ptr<StatementAstNode>_>_>
           *)(local_78 + 0x10));
  return poVar5;
}

Assistant:

const std::optional<std::shared_ptr<ScriptAstNode>>
Parser::parseScript() noexcept {

  // we're assuming were before the start of the tape,
  // move the tape to the first token
  this->tokenBuffer->nextToken();

  bool error = false;
  std::vector<std::shared_ptr<StatementAstNode>> statements;

  while (true) {
    this->skipWhiteSpace();

    TokenType t = this->tokenBuffer->currentToken()->tokenType;

    if (t == TokenType::EndOfFile) {
      break;
    }

    auto statement = this->parseStatement();

    if (statement) {
      statements.push_back(statement.value());

    } else {
      error = true;
    }
  }

  if (error) { return std::nullopt; }

  return std::make_shared<ScriptAstNode>(statements);
}